

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testInvalid_OnlyModelInputs(void)

{
  bool bVar1;
  TypeUnion TVar2;
  NetworkUpdateParameters *this;
  Type *this_00;
  CategoricalCrossEntropyLossLayer *this_01;
  ostream *poVar3;
  ModelDescription *this_02;
  Type *pTVar4;
  FeatureType *this_03;
  ArrayFeatureType *this_04;
  int iVar5;
  Model spec;
  Result res;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [24];
  Model local_130;
  pointer local_100;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes local_48;
  TensorAttributes local_38;
  
  CoreML::Specification::Model::Model(&local_130);
  CoreML::Result::Result((Result *)&local_100);
  local_38.name = "InTensor";
  local_38.dimension = 3;
  local_38._12_4_ = 0;
  local_48.name = "OutTensor";
  local_48.dimension = 1;
  local_48._12_4_ = 0;
  buildBasicNeuralNetworkModel(&local_130,true,&local_38,&local_48,0x400,false,false);
  local_130.specificationversion_ = 4;
  if (local_130._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_130);
    local_130._oneof_case_[0] = 500;
    TVar2.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar2.neuralnetwork_);
    local_130.Type_.pipelineclassifier_ = TVar2.pipelineclassifier_;
  }
  TVar2 = local_130.Type_;
  addSoftmaxLayer(&local_130,"softmax","OutTensor","softmax_out");
  this = (TVar2.neuralnetworkregressor_)->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    (TVar2.neuralnetworkregressor_)->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"cross_entropy_loss_layer","")
  ;
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  if (this_00->_oneof_case_[0] == 10) {
    this_01 = (this_00->LossLayerType_).categoricalcrossentropylosslayer_;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 10;
    this_01 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
              (this_01);
    (this_00->LossLayerType_).categoricalcrossentropylosslayer_ = this_01;
  }
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"softmax_out","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_01->input_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  local_158 = (undefined1  [8])local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"target","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_01->target_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_158);
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158,local_148._0_8_ + 1);
  }
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (TVar2.neuralnetwork_,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (TVar2.neuralnetwork_,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (TVar2.neuralnetwork_,100,1,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (TVar2.neuralnetwork_,0x7e3,0,0x7e3,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  CoreML::Model::validate((Result *)local_158,&local_130);
  local_100 = (pointer)local_158;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_150);
  if (local_150._M_p != local_148 + 8) {
    operator_delete(local_150._M_p,local_148._8_8_ + 1);
  }
  bVar1 = CoreML::Result::good((Result *)&local_100);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x59d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    iVar5 = 1;
    std::ostream::flush();
  }
  else {
    if (local_130.description_ == (ModelDescription *)0x0) {
      this_02 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(this_02);
      local_130.description_ = this_02;
    }
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&((local_130.description_)->traininginput_).super_RepeatedPtrFieldBase,
                        (Type *)0x0);
    local_158 = (undefined1  [8])local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"target","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar4->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (string *)local_158);
    if (local_158 != (undefined1  [8])local_148) {
      operator_delete((void *)local_158,local_148._0_8_ + 1);
    }
    this_03 = pTVar4->type_;
    if (this_03 == (FeatureType *)0x0) {
      this_03 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(this_03);
      pTVar4->type_ = this_03;
    }
    if (this_03->_oneof_case_[0] == 5) {
      this_04 = (this_03->Type_).multiarraytype_;
    }
    else {
      CoreML::Specification::FeatureType::clear_Type(this_03);
      this_03->_oneof_case_[0] = 5;
      this_04 = (ArrayFeatureType *)operator_new(0x48);
      CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_04);
      (this_03->Type_).multiarraytype_ = this_04;
    }
    this_04->datatype_ = 0x20020;
    iVar5 = (this_04->shape_).current_size_;
    if (iVar5 == (this_04->shape_).total_size_) {
      google::protobuf::RepeatedField<long>::Reserve(&this_04->shape_,iVar5 + 1);
      iVar5 = (this_04->shape_).current_size_;
    }
    (this_04->shape_).current_size_ = iVar5 + 1;
    ((this_04->shape_).rep_)->elements[iVar5] = 1;
    CoreML::Model::validate((Result *)local_158,&local_130);
    local_100 = (pointer)local_158;
    std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_150);
    if (local_150._M_p != local_148 + 8) {
      operator_delete(local_150._M_p,local_148._8_8_ + 1);
    }
    bVar1 = CoreML::Result::good((Result *)&local_100);
    iVar5 = 0;
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x7c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x5a7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      iVar5 = 1;
      std::ostream::flush();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_130);
  return iVar5;
}

Assistant:

int testInvalid_OnlyModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input("softmax_out");
    ceLossLayer->set_target("target");

    // Not clearing training inputs or explicitly adding model inputs as buildBasicNeuralNetworkModel() adds model inputs to training inputs

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    // Add target to training inputs
    auto trainingInputTarget = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInputTarget->set_name("target");
    auto trainingInputTensorShape = trainingInputTarget->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}